

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsCreators.cpp
# Opt level: O1

void chrono::utils::AddTorusGeometry
               (ChBody *body,shared_ptr<chrono::ChMaterialSurface> *material,double radius,
               double thickness,int segments,int angle,ChVector<double> *pos,
               ChQuaternion<double> *rot,bool visualization,
               shared_ptr<chrono::ChVisualMaterial> *vis_material)

{
  undefined1 auVar1 [16];
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  Quaternion q;
  ChQuaternion<double> local_e8;
  shared_ptr<chrono::ChVisualMaterial> local_c8;
  shared_ptr<chrono::ChMaterialSurface> local_b8;
  double local_a8;
  ChBody *local_a0;
  double local_98;
  double local_90;
  double local_88;
  undefined8 uStack_80;
  ChQuaternion<double> local_78;
  ChQuaternion<double> local_50;
  
  if (0 < angle) {
    local_a8 = (((radius + thickness) * 6.283185307179586) / (double)segments) * 0.5;
    iVar2 = 0;
    local_a0 = body;
    do {
      local_88 = ((double)iVar2 * 3.141592653589793) / 180.0;
      uStack_80 = 0;
      local_90 = cos(local_88);
      local_98 = sin(local_88);
      auVar1._8_8_ = uStack_80;
      auVar1._0_8_ = local_88;
      auVar3._8_8_ = 0x8000000000000000;
      auVar3._0_8_ = 0x8000000000000000;
      auVar3 = vxorpd_avx512vl(auVar1,auVar3);
      Q_from_AngAxis(&local_e8,auVar3._0_8_,(ChVector<double> *)&VECT_Y);
      Q_from_AngAxis(&local_50,1.5707963267948966,(ChVector<double> *)&VECT_X);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_e8.m_data[0];
      auVar5._8_8_ = 0;
      auVar5._0_8_ = local_e8.m_data[1];
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_50.m_data[0];
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_50.m_data[1];
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_50.m_data[1] * local_e8.m_data[1];
      auVar3 = vfmsub231sd_fma(auVar9,auVar4,auVar6);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_e8.m_data[2];
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_50.m_data[2];
      auVar3 = vfnmadd231sd_fma(auVar3,auVar10,auVar11);
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_e8.m_data[3];
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_50.m_data[3];
      auVar6 = vfnmadd231sd_fma(auVar3,auVar12,auVar13);
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_50.m_data[0] * local_e8.m_data[1];
      auVar3 = vfmadd231sd_fma(auVar14,auVar4,auVar8);
      auVar3 = vfnmadd231sd_fma(auVar3,auVar12,auVar11);
      auVar3 = vfmadd231sd_fma(auVar3,auVar10,auVar13);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_50.m_data[0] * local_e8.m_data[2];
      auVar1 = vfmadd231sd_fma(auVar15,auVar4,auVar11);
      auVar1 = vfmadd231sd_fma(auVar1,auVar12,auVar8);
      auVar9 = vfnmadd231sd_fma(auVar1,auVar5,auVar13);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_50.m_data[0] * local_e8.m_data[3];
      auVar1 = vfmadd231sd_fma(auVar7,auVar4,auVar13);
      auVar1 = vfnmadd231sd_fma(auVar1,auVar10,auVar8);
      auVar1 = vfmadd231sd_fma(auVar1,auVar5,auVar11);
      local_78.m_data[0] = auVar6._0_8_;
      local_78.m_data[1] = auVar3._0_8_;
      local_78.m_data[2] = auVar9._0_8_;
      local_78.m_data[3] = auVar1._0_8_;
      local_b8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
      local_b8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)
               ._M_refcount._M_pi;
      if (local_b8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_b8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_b8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_b8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_b8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_e8.m_data[0] = radius * local_90 + pos->m_data[0];
      local_e8.m_data[1] = pos->m_data[1] + 0.0;
      local_e8.m_data[2] = radius * local_98 + pos->m_data[2];
      local_c8.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (vis_material->super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
      local_c8.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (vis_material->
              super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
              _M_pi;
      if (local_c8.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_c8.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_c8.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_c8.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_c8.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      AddCapsuleGeometry(local_a0,&local_b8,thickness,local_a8,(ChVector<double> *)&local_e8,
                         &local_78,visualization,&local_c8);
      if (local_c8.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_c8.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_b8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b8.
                   super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      iVar2 = iVar2 + angle / segments;
    } while (iVar2 < angle);
  }
  return;
}

Assistant:

void AddTorusGeometry(ChBody* body,
                      std::shared_ptr<ChMaterialSurface> material,
                      double radius,
                      double thickness,
                      int segments,
                      int angle,
                      const ChVector<>& pos,
                      const ChQuaternion<>& rot,
                      bool visualization,
                      std::shared_ptr<ChVisualMaterial> vis_material) {
    for (int i = 0; i < angle; i += angle / segments) {
        double alpha = i * CH_C_PI / 180.0;
        double x = cos(alpha) * radius;
        double z = sin(alpha) * radius;
        Quaternion q = chrono::Q_from_AngAxis(-alpha, VECT_Y) % chrono::Q_from_AngAxis(CH_C_PI / 2.0, VECT_X);
        double outer_circ = 2 * CH_C_PI * (radius + thickness);

        AddCapsuleGeometry(body, material, thickness, outer_circ / segments * .5, ChVector<>(x, 0, z) + pos, q,
                           visualization, vis_material);
    }
}